

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void hash_df(cf_chash *H,void *in1,size_t nin1,void *in2,size_t nin2,void *in3,size_t nin3,void *in4
            ,size_t nin4,uint8_t *out,size_t nout)

{
  size_t local_200;
  size_t take;
  cf_chash_ctx ctx;
  uint8_t block [64];
  uint8_t cbuf [4];
  uint32_t bits_to_return;
  uint8_t counter;
  void *in3_local;
  size_t nin2_local;
  void *in2_local;
  size_t nin1_local;
  void *in1_local;
  cf_chash *H_local;
  
  cbuf[3] = '\x01';
  write32_be((uint32_t)(nout << 3),block + 0x3c);
  for (; nout != 0; nout = nout - local_200) {
    (*H->init)(&take);
    (*H->update)(&take,cbuf + 3,1);
    (*H->update)(&take,block + 0x3c,4);
    (*H->update)(&take,in1,nin1);
    (*H->update)(&take,in2,nin2);
    (*H->update)(&take,in3,nin3);
    (*H->update)(&take,in4,nin4);
    (*H->digest)(&take,ctx.ctx + 0x160);
    if (H->hashsz < nout) {
      local_200 = H->hashsz;
    }
    else {
      local_200 = nout;
    }
    memcpy(out,ctx.ctx + 0x160,local_200);
    out = out + local_200;
    cbuf[3] = cbuf[3] + '\x01';
  }
  return;
}

Assistant:

static void hash_df(const cf_chash *H,
                    const void *in1, size_t nin1,
                    const void *in2, size_t nin2,
                    const void *in3, size_t nin3,
                    const void *in4, size_t nin4,
                    uint8_t *out, size_t nout)
{
  uint8_t counter = 1;
  uint32_t bits_to_return = nout * 8;
  uint8_t cbuf[4];
  uint8_t block[CF_MAXHASH];

  write32_be(bits_to_return, cbuf);

  while (nout)
  {
    /* Make a block.  This is the hash of:
     *   counter || bits_to_return || in1 || in2 || in3 | in4
     */
    cf_chash_ctx ctx;
    H->init(&ctx);
    H->update(&ctx, &counter, sizeof counter);
    H->update(&ctx, cbuf, sizeof cbuf);
    H->update(&ctx, in1, nin1);
    H->update(&ctx, in2, nin2);
    H->update(&ctx, in3, nin3);
    H->update(&ctx, in4, nin4);
    H->digest(&ctx, block);

    size_t take = MIN(H->hashsz, nout);
    memcpy(out, block, take);
    out += take;
    nout -= take;

    counter += 1;
  }
}